

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v7::detail::int_writer<fmt::v7::detail::buffer_appender<char>,char,unsigned__int128>::
int_writer<unsigned__int128>
          (int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned___int128> *this,
          buffer_appender<char> output,locale_ref loc,unsigned___int128 value,
          basic_format_specs<char> *s)

{
  long *plVar1;
  long lVar2;
  undefined1 auVar3 [16];
  bool bVar4;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined6 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8e;
  undefined1 in_stack_ffffffffffffff8f;
  undefined1 uVar5;
  
  *in_RDI = in_RSI;
  in_RDI[1] = in_RDX;
  in_RDI[2] = in_R9;
  in_RDI[5] = in_R8;
  in_RDI[4] = in_RCX;
  *(undefined4 *)((long)in_RDI + 0x34) = 0;
  auVar3[6] = in_stack_ffffffffffffff8e;
  auVar3._0_6_ = in_stack_ffffffffffffff88;
  auVar3[7] = in_stack_ffffffffffffff8f;
  auVar3._8_8_ = in_RDI;
  bVar4 = is_negative<unsigned___int128,_0>((unsigned___int128)auVar3);
  if (bVar4) {
    *(undefined1 *)(in_RDI + 6) = 0x2d;
    *(int *)((long)in_RDI + 0x34) = *(int *)((long)in_RDI + 0x34) + 1;
    plVar1 = in_RDI + 4;
    lVar2 = *plVar1;
    *plVar1 = -*plVar1;
    in_RDI[5] = -(ulong)(lVar2 != 0) - in_RDI[5];
  }
  else if (((*(byte *)(in_RDI[2] + 9) >> 4 & 7) != 0) && ((*(byte *)(in_RDI[2] + 9) >> 4 & 7) != 1))
  {
    uVar5 = 0x2b;
    if ((*(byte *)(in_RDI[2] + 9) >> 4 & 7) != 2) {
      uVar5 = 0x20;
    }
    *(undefined1 *)(in_RDI + 6) = uVar5;
    *(int *)((long)in_RDI + 0x34) = *(int *)((long)in_RDI + 0x34) + 1;
  }
  return;
}

Assistant:

int_writer(OutputIt output, locale_ref loc, Int value,
             const basic_format_specs<Char>& s)
      : out(output),
        locale(loc),
        specs(s),
        abs_value(static_cast<UInt>(value)),
        prefix_size(0) {
    static_assert(std::is_same<uint32_or_64_or_128_t<Int>, UInt>::value, "");
    if (is_negative(value)) {
      prefix[0] = '-';
      ++prefix_size;
      abs_value = 0 - abs_value;
    } else if (specs.sign != sign::none && specs.sign != sign::minus) {
      prefix[0] = specs.sign == sign::plus ? '+' : ' ';
      ++prefix_size;
    }
  }